

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

LY_ERR moveto_op_comp(lyxp_set *set1,lyxp_set *set2,char *op,ly_bool *result)

{
  longdouble lVar1;
  char cVar2;
  lyxp_set_type lVar3;
  lyxp_set_type lVar4;
  longdouble lVar5;
  LY_ERR LVar6;
  int iVar7;
  uint32_t idx1;
  bool bVar8;
  
  lVar3 = set1->type;
  if (lVar3 == LYXP_SET_NODE_SET) {
    idx1 = 0;
    if (set1->used == 0) goto LAB_001a9c25;
    do {
      LVar6 = moveto_op_comp_item(set1,idx1,set2,op,'\0',result);
      if (LVar6 != LY_SUCCESS) {
        return LVar6;
      }
      if (*result != '\0') {
        return LY_SUCCESS;
      }
      idx1 = idx1 + 1;
    } while (idx1 < set1->used);
  }
  else {
    lVar4 = set2->type;
    if (lVar4 != LYXP_SET_NODE_SET) {
      if ((*op == '=') || (*op == '!')) {
        if (lVar3 == LYXP_SET_BOOLEAN || lVar4 == LYXP_SET_BOOLEAN) {
          lyxp_set_cast(set1,LYXP_SET_BOOLEAN);
          lyxp_set_cast(set2,LYXP_SET_BOOLEAN);
        }
        else if (lVar3 == LYXP_SET_NUMBER || lVar4 == LYXP_SET_NUMBER) goto LAB_001a9b02;
      }
      else {
LAB_001a9b02:
        LVar6 = lyxp_set_cast(set1,LYXP_SET_NUMBER);
        if (LVar6 != LY_SUCCESS) {
          return LVar6;
        }
        LVar6 = lyxp_set_cast(set2,LYXP_SET_NUMBER);
        if (LVar6 != LY_SUCCESS) {
          return LVar6;
        }
      }
      lVar3 = set1->type;
      if (lVar3 != set2->type) {
        __assert_fail("set1->type == set2->type",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                      ,0x1cd9,
                      "LY_ERR moveto_op_comp(struct lyxp_set *, struct lyxp_set *, const char *, ly_bool *)"
                     );
      }
      cVar2 = *op;
      if (cVar2 == '!') {
        if (lVar3 == LYXP_SET_STRING) {
          iVar7 = strcmp((set1->val).str,(set2->val).str);
          bVar8 = iVar7 == 0;
        }
        else {
          if (lVar3 == LYXP_SET_NUMBER) {
            idx1 = (uint32_t)((set1->val).num != (set2->val).num);
            goto LAB_001a9c25;
          }
          if (lVar3 != LYXP_SET_BOOLEAN) {
            __assert_fail("set1->type == LYXP_SET_STRING",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                          ,0x1ceb,
                          "LY_ERR moveto_op_comp(struct lyxp_set *, struct lyxp_set *, const char *, ly_bool *)"
                         );
          }
          bVar8 = (set1->val).bln == (set2->val).bln;
        }
        idx1 = (uint32_t)!bVar8;
      }
      else if (cVar2 == '=') {
        if (lVar3 == LYXP_SET_STRING) {
          iVar7 = strcmp((set1->val).str,(set2->val).str);
          bVar8 = iVar7 == 0;
        }
        else {
          if (lVar3 == LYXP_SET_NUMBER) {
            idx1 = (uint32_t)((set1->val).num == (set2->val).num);
            goto LAB_001a9c25;
          }
          if (lVar3 != LYXP_SET_BOOLEAN) {
            __assert_fail("set1->type == LYXP_SET_STRING",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                          ,0x1ce2,
                          "LY_ERR moveto_op_comp(struct lyxp_set *, struct lyxp_set *, const char *, ly_bool *)"
                         );
          }
          bVar8 = (set1->val).bln == (set2->val).bln;
        }
        idx1 = (uint32_t)bVar8;
      }
      else {
        if (lVar3 != LYXP_SET_NUMBER) {
          __assert_fail("set1->type == LYXP_SET_NUMBER",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                        ,0x1cef,
                        "LY_ERR moveto_op_comp(struct lyxp_set *, struct lyxp_set *, const char *, ly_bool *)"
                       );
        }
        lVar1 = (set2->val).num;
        lVar5 = (set1->val).num;
        if (cVar2 == '<') {
          lVar5 = lVar1;
          lVar1 = (set1->val).num;
        }
        if (op[1] == '=') {
          idx1 = (uint32_t)(lVar1 <= lVar5);
        }
        else {
          idx1 = (uint32_t)(lVar1 < lVar5);
        }
      }
      goto LAB_001a9c25;
    }
    idx1 = 0;
    if (set2->used == 0) goto LAB_001a9c25;
    do {
      LVar6 = moveto_op_comp_item(set2,idx1,set1,op,'\x01',result);
      if (LVar6 != LY_SUCCESS) {
        return LVar6;
      }
      if (*result != '\0') {
        return LY_SUCCESS;
      }
      idx1 = idx1 + 1;
    } while (idx1 < set2->used);
  }
  idx1 = 0;
LAB_001a9c25:
  *result = (ly_bool)idx1;
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
moveto_op_comp(struct lyxp_set *set1, struct lyxp_set *set2, const char *op, ly_bool *result)
{
    /*
     * NODE SET + NODE SET = NODE SET + STRING /(1 NODE SET) 2 STRING
     * NODE SET + STRING = STRING + STRING     /1 STRING (2 STRING)
     * NODE SET + NUMBER = NUMBER + NUMBER     /1 NUMBER (2 NUMBER)
     * NODE SET + BOOLEAN = BOOLEAN + BOOLEAN  /1 BOOLEAN (2 BOOLEAN)
     * STRING + NODE SET = STRING + STRING     /(1 STRING) 2 STRING
     * NUMBER + NODE SET = NUMBER + NUMBER     /(1 NUMBER) 2 NUMBER
     * BOOLEAN + NODE SET = BOOLEAN + BOOLEAN  /(1 BOOLEAN) 2 BOOLEAN
     *
     * '=' or '!='
     * BOOLEAN + BOOLEAN
     * BOOLEAN + STRING = BOOLEAN + BOOLEAN    /(1 BOOLEAN) 2 BOOLEAN
     * BOOLEAN + NUMBER = BOOLEAN + BOOLEAN    /(1 BOOLEAN) 2 BOOLEAN
     * STRING + BOOLEAN = BOOLEAN + BOOLEAN    /1 BOOLEAN (2 BOOLEAN)
     * NUMBER + BOOLEAN = BOOLEAN + BOOLEAN    /1 BOOLEAN (2 BOOLEAN)
     * NUMBER + NUMBER
     * NUMBER + STRING = NUMBER + NUMBER       /(1 NUMBER) 2 NUMBER
     * STRING + NUMBER = NUMBER + NUMBER       /1 NUMBER (2 NUMBER)
     * STRING + STRING
     *
     * '<=', '<', '>=', '>'
     * NUMBER + NUMBER
     * BOOLEAN + BOOLEAN = NUMBER + NUMBER     /1 NUMBER, 2 NUMBER
     * BOOLEAN + NUMBER = NUMBER + NUMBER      /1 NUMBER (2 NUMBER)
     * BOOLEAN + STRING = NUMBER + NUMBER      /1 NUMBER, 2 NUMBER
     * NUMBER + STRING = NUMBER + NUMBER       /(1 NUMBER) 2 NUMBER
     * STRING + STRING = NUMBER + NUMBER       /1 NUMBER, 2 NUMBER
     * STRING + NUMBER = NUMBER + NUMBER       /1 NUMBER (2 NUMBER)
     * NUMBER + BOOLEAN = NUMBER + NUMBER      /(1 NUMBER) 2 NUMBER
     * STRING + BOOLEAN = NUMBER + NUMBER      /(1 NUMBER) 2 NUMBER
     */
    uint32_t i;
    LY_ERR rc;

    /* iterative evaluation with node-sets */
    if ((set1->type == LYXP_SET_NODE_SET) || (set2->type == LYXP_SET_NODE_SET)) {
        if (set1->type == LYXP_SET_NODE_SET) {
            for (i = 0; i < set1->used; ++i) {
                /* evaluate for the single item */
                LY_CHECK_RET(moveto_op_comp_item(set1, i, set2, op, 0, result));

                /* lazy evaluation until true */
                if (*result) {
                    return LY_SUCCESS;
                }
            }
        } else {
            for (i = 0; i < set2->used; ++i) {
                /* evaluate for the single item */
                LY_CHECK_RET(moveto_op_comp_item(set2, i, set1, op, 1, result));

                /* lazy evaluation until true */
                if (*result) {
                    return LY_SUCCESS;
                }
            }
        }

        /* false for all the nodes */
        *result = 0;
        return LY_SUCCESS;
    }

    /* first convert properly */
    if ((op[0] == '=') || (op[0] == '!')) {
        if ((set1->type == LYXP_SET_BOOLEAN) || (set2->type == LYXP_SET_BOOLEAN)) {
            lyxp_set_cast(set1, LYXP_SET_BOOLEAN);
            lyxp_set_cast(set2, LYXP_SET_BOOLEAN);
        } else if ((set1->type == LYXP_SET_NUMBER) || (set2->type == LYXP_SET_NUMBER)) {
            rc = lyxp_set_cast(set1, LYXP_SET_NUMBER);
            LY_CHECK_RET(rc);
            rc = lyxp_set_cast(set2, LYXP_SET_NUMBER);
            LY_CHECK_RET(rc);
        } /* else we have 2 strings */
    } else {
        rc = lyxp_set_cast(set1, LYXP_SET_NUMBER);
        LY_CHECK_RET(rc);
        rc = lyxp_set_cast(set2, LYXP_SET_NUMBER);
        LY_CHECK_RET(rc);
    }

    assert(set1->type == set2->type);

    /* compute result */
    if (op[0] == '=') {
        if (set1->type == LYXP_SET_BOOLEAN) {
            *result = (set1->val.bln == set2->val.bln);
        } else if (set1->type == LYXP_SET_NUMBER) {
            *result = (set1->val.num == set2->val.num);
        } else {
            assert(set1->type == LYXP_SET_STRING);
            *result = strcmp(set1->val.str, set2->val.str) ? 0 : 1;
        }
    } else if (op[0] == '!') {
        if (set1->type == LYXP_SET_BOOLEAN) {
            *result = (set1->val.bln != set2->val.bln);
        } else if (set1->type == LYXP_SET_NUMBER) {
            *result = (set1->val.num != set2->val.num);
        } else {
            assert(set1->type == LYXP_SET_STRING);
            *result = strcmp(set1->val.str, set2->val.str) ? 1 : 0;
        }
    } else {
        assert(set1->type == LYXP_SET_NUMBER);
        if (op[0] == '<') {
            if (op[1] == '=') {
                *result = (set1->val.num <= set2->val.num);
            } else {
                *result = (set1->val.num < set2->val.num);
            }
        } else {
            if (op[1] == '=') {
                *result = (set1->val.num >= set2->val.num);
            } else {
                *result = (set1->val.num > set2->val.num);
            }
        }
    }

    return LY_SUCCESS;
}